

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Object * json::Json::createObject(Object *__return_storage_ptr__,Node *O)

{
  _Rb_tree_header *p_Var1;
  pointer pNVar2;
  undefined8 uVar3;
  
  (__return_storage_ptr__->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  p_Var1 = &(__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pNVar2 = (O->production).nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(O->production).nodes.
                         super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar2 >> 5) *
                 -0x5555555555555555)) {
    nextRecord(__return_storage_ptr__,pNVar2 + 1);
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  (__return_storage_ptr__->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00128c98;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
  ::~_Rb_tree(&(__return_storage_ptr__->fields)._M_t);
  _Unwind_Resume(uVar3);
}

Assistant:

static Object createObject(parser::Node const& O) {
            Object object;
            parser::Node const& RS = O.getProduction().nodes.at(1);
            nextRecord(object, RS);
            return object;
        }